

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.h
# Opt level: O2

bool Js::OnlyWritablePropertyCache::ProcessProperty<Js::PropertyRecord_const*>
               (DynamicTypeHandler *typeHandler,PropertyAttributes attributes,
               PropertyRecord *propertyKey,ScriptContext *scriptContext)

{
  PropertyId propertyId;
  bool bVar1;
  
  if ((attributes & 4) != 0) {
    return false;
  }
  DynamicTypeHandler::ClearHasOnlyWritableDataProperties(typeHandler);
  bVar1 = (typeHandler->flags & 0x20) != 0;
  if (bVar1) {
    propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,propertyKey);
    ScriptContext::InvalidateStoreFieldCaches(scriptContext,propertyId);
  }
  return bVar1;
}

Assistant:

inline bool
OnlyWritablePropertyCache::ProcessProperty(
    _In_ DynamicTypeHandler* typeHandler,
    PropertyAttributes attributes,
    _In_ KeyType propertyKey,
    ScriptContext * scriptContext)
{
    if (!(attributes & PropertyWritable))
    {
        typeHandler->ClearHasOnlyWritableDataProperties();
        if (typeHandler->GetFlags() & DynamicTypeHandler::IsPrototypeFlag)
        {
            PropertyId propertyId = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext, propertyKey);
            scriptContext->InvalidateStoreFieldCaches(propertyId);
            return true;
        }
    }
    return false;
}